

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O0

void __thiscall CoreML::Specification::CropResizeLayerParams::Clear(CropResizeLayerParams *this)

{
  Arena *pAVar1;
  CropResizeLayerParams *this_local;
  
  google::protobuf::RepeatedField<unsigned_long>::Clear(&this->targetsize_);
  pAVar1 = GetArenaNoVirtual(this);
  if (((pAVar1 == (Arena *)0x0) && (this->mode_ != (SamplingMode *)0x0)) &&
     (this->mode_ != (SamplingMode *)0x0)) {
    (*(this->mode_->super_MessageLite)._vptr_MessageLite[1])();
  }
  this->mode_ = (SamplingMode *)0x0;
  pAVar1 = GetArenaNoVirtual(this);
  if (((pAVar1 == (Arena *)0x0) && (this->boxindicesmode_ != (BoxCoordinatesMode *)0x0)) &&
     (this->boxindicesmode_ != (BoxCoordinatesMode *)0x0)) {
    (*(this->boxindicesmode_->super_MessageLite)._vptr_MessageLite[1])();
  }
  this->boxindicesmode_ = (BoxCoordinatesMode *)0x0;
  memset(&this->normalizedcoordinates_,0,8);
  return;
}

Assistant:

void CropResizeLayerParams::Clear() {
// @@protoc_insertion_point(message_clear_start:CoreML.Specification.CropResizeLayerParams)
  targetsize_.Clear();
  if (GetArenaNoVirtual() == NULL && mode_ != NULL) {
    delete mode_;
  }
  mode_ = NULL;
  if (GetArenaNoVirtual() == NULL && boxindicesmode_ != NULL) {
    delete boxindicesmode_;
  }
  boxindicesmode_ = NULL;
  ::memset(&normalizedcoordinates_, 0, reinterpret_cast<char*>(&spatialscale_) -
    reinterpret_cast<char*>(&normalizedcoordinates_) + sizeof(spatialscale_));
}